

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

void __thiscall
Js::TypedArray<short,_false,_true>::SortHelper
          (TypedArray<short,_false,_true> *this,byte *listBuffer,uint32 length,
          RecyclableObject *compareFn,ScriptContext *scriptContext,ArenaAllocator *allocator)

{
  undefined1 local_58 [8];
  CompareVarsInfo cvInfo;
  short *list;
  ArenaAllocator *allocator_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *compareFn_local;
  uint32 length_local;
  byte *listBuffer_local;
  TypedArray<short,_false,_true> *this_local;
  
  cvInfo.compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)listBuffer;
  Js::JavascriptArray::CompareVarsInfo::CompareVarsInfo((CompareVarsInfo *)local_58);
  local_58 = (undefined1  [8])scriptContext;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
            ((WriteBarrierPtr<Js::RecyclableObject> *)&cvInfo,compareFn);
  cvInfo.compFn.ptr = (RecyclableObject *)TypedArrayCompareElementsHelper<short>;
  Js::JavascriptArray::TypedArraySort<short>
            ((short *)cvInfo.compareType,length,(CompareVarsInfo *)local_58,allocator);
  return;
}

Assistant:

void SortHelper(byte* listBuffer, uint32 length, RecyclableObject* compareFn, ScriptContext* scriptContext, ArenaAllocator* allocator)
        {
            TypeName* list = reinterpret_cast<TypeName*>(listBuffer);
            JavascriptArray::CompareVarsInfo cvInfo;
            cvInfo.scriptContext = scriptContext;
            cvInfo.compFn = compareFn;
            cvInfo.compareType = &TypedArrayCompareElementsHelper<TypeName>;
            JavascriptArray::TypedArraySort<TypeName>(list, length, &cvInfo, allocator);
        }